

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reduction.hpp
# Opt level: O0

void mxx::custom_op<int>::custom_function<int_const&(*)(int_const&,int_const&)>
               (_func_int_ptr_int_ptr_int_ptr *func,void *invec,void *inoutvec,int *len,
               MPI_Datatype *dt)

{
  undefined4 *puVar1;
  long local_60;
  MPI_Aint true_lb;
  MPI_Aint true_extent;
  undefined1 local_48 [4];
  int inout_buf;
  int in_buf;
  int i;
  int *inout;
  int *in;
  MPI_Datatype *dt_local;
  int *len_local;
  void *inoutvec_local;
  void *invec_local;
  _func_int_ptr_int_ptr_int_ptr *func_local;
  
  in = (int *)dt;
  dt_local = (MPI_Datatype *)len;
  len_local = (int *)inoutvec;
  inoutvec_local = invec;
  invec_local = func;
  if (1 < *len) {
    _in_buf = inoutvec;
    inout = (int *)invec;
    for (inout_buf = 0; inout_buf < *(int *)dt_local + -1; inout_buf = inout_buf + 1) {
      puVar1 = (undefined4 *)
               (*(code *)invec_local)
                         (inout + inout_buf,(void *)((long)_in_buf + (long)inout_buf * 4));
      *(undefined4 *)((long)_in_buf + (long)inout_buf * 4) = *puVar1;
    }
  }
  MPI_Type_get_true_extent(*(undefined8 *)in,&local_60,&true_lb);
  memcpy(local_48 + local_60,(void *)((long)inoutvec_local + (long)(*(int *)dt_local + -1) * 4),
         true_lb);
  memcpy(local_48 + local_60 + -4,len_local + (*(int *)dt_local + -1),true_lb);
  puVar1 = (undefined4 *)(*(code *)invec_local)(local_48,(long)&true_extent + 4);
  true_extent._4_4_ = *puVar1;
  memcpy(len_local + (*(int *)dt_local + -1),local_48 + local_60 + -4,true_lb);
  return;
}

Assistant:

static void custom_function(Func func, void* invec, void* inoutvec, int* len, MPI_Datatype* dt) {
        if (*len > 1) {
            T* in = (T*) invec;
            T* inout = (T*) inoutvec;
            for (int i = 0; i < *len-1; ++i) {
                inout[i] = func(in[i], inout[i]);
            }
        }
        // only read and write the `true_extent` of the datatype
        // for the last item (otherwise we might encounter a memory error)
        // [see github OpenMPI issue #1462]
        T in_buf;
        T inout_buf;
        MPI_Aint true_extent, true_lb;
        MPI_Type_get_true_extent(*dt, &true_lb, &true_extent);
        std::memcpy((char*)&in_buf+true_lb, (char*)invec+(sizeof(T)*(*len-1)), true_extent);
        std::memcpy((char*)&inout_buf+true_lb, (char*)inoutvec+(sizeof(T)*(*len-1)), true_extent);
        // now do the operation on our local buffers
        inout_buf = func(in_buf, inout_buf);
        // copy the results back, again only to true_extent
        std::memcpy((char*)inoutvec+(sizeof(T)*(*len - 1)), (char*)&inout_buf+true_lb, true_extent);
    }